

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_0::BufferTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferTestInstance *this)

{
  qpTestResult qVar1;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  NotSupportedError *pNVar2;
  allocator<char> local_169;
  string local_168;
  uint local_144;
  byte local_13d;
  int local_13c;
  undefined8 uStack_138;
  int i;
  VkDeviceSize testSizes [5];
  VkPhysicalDeviceFeatures local_fc;
  VkPhysicalDeviceFeatures *local_20;
  VkPhysicalDeviceFeatures *physicalDeviceFeatures;
  BufferTestInstance *this_local;
  TestStatus *testStatus;
  
  physicalDeviceFeatures = (VkPhysicalDeviceFeatures *)this;
  this_local = (BufferTestInstance *)__return_storage_ptr__;
  vk = getInstanceInterface(this);
  physicalDevice = getPhysicalDevice(this);
  ::vk::getPhysicalDeviceFeatures(&local_fc,vk,physicalDevice);
  local_20 = &local_fc;
  if ((((this->m_testCase).flags & 1) != 0) && (local_fc.sparseBinding == 0)) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Sparse bindings feature is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
               ,0x16d);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((((this->m_testCase).flags & 2) != 0) && (local_fc.sparseResidencyBuffer == 0)) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Sparse buffer residency feature is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
               ,0x170);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((((this->m_testCase).flags & 4) != 0) && (local_fc.sparseResidencyAliased == 0)) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar2,"Sparse aliased residency feature is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferTests.cpp"
               ,0x173);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  memset(&stack0xfffffffffffffec8,0,0x28);
  uStack_138 = 1;
  testSizes[0] = 0x49d;
  testSizes[1] = 0x3e77;
  testSizes[2] = 0x4000;
  testSizes[3] = 0xffffffffffffffff;
  local_13c = 0;
  while( true ) {
    if (4 < local_13c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"Pass",&local_169);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      return __return_storage_ptr__;
    }
    local_13d = 0;
    bufferCreateAndAllocTest(__return_storage_ptr__,this,testSizes[(long)local_13c + -1]);
    qVar1 = tcu::TestStatus::getCode(__return_storage_ptr__);
    if (qVar1 != QP_TEST_RESULT_PASS) {
      local_13d = 1;
    }
    local_144 = (uint)(qVar1 != QP_TEST_RESULT_PASS);
    if ((local_13d & 1) == 0) {
      tcu::TestStatus::~TestStatus(__return_storage_ptr__);
    }
    if (local_144 != 0) break;
    local_13c = local_13c + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferTestInstance::iterate (void)
{
	const VkPhysicalDeviceFeatures&	physicalDeviceFeatures	= getPhysicalDeviceFeatures(getInstanceInterface(), getPhysicalDevice());

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_BINDING_BIT ) && !physicalDeviceFeatures.sparseBinding)
		TCU_THROW(NotSupportedError, "Sparse bindings feature is not supported");

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT ) && !physicalDeviceFeatures.sparseResidencyBuffer)
		TCU_THROW(NotSupportedError, "Sparse buffer residency feature is not supported");

	if ((m_testCase.flags & VK_BUFFER_CREATE_SPARSE_ALIASED_BIT ) && !physicalDeviceFeatures.sparseResidencyAliased)
		TCU_THROW(NotSupportedError, "Sparse aliased residency feature is not supported");

	const VkDeviceSize testSizes[] =
	{
		1,
		1181,
		15991,
		16384,
		~0ull,		// try to exercise a very large buffer too (will be clamped to a sensible size later)
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(testSizes); ++i)
	{
		const tcu::TestStatus testStatus = bufferCreateAndAllocTest(testSizes[i]);

		if (testStatus.getCode() != QP_TEST_RESULT_PASS)
			return testStatus;
	}

	return tcu::TestStatus::pass("Pass");
}